

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_toolbar.cpp
# Opt level: O3

void QtMWidgets::ToolBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  Alignment AVar4;
  undefined8 *puVar5;
  QSize QVar6;
  int iVar7;
  Orientation orientation;
  QSize *pQVar8;
  undefined8 local_20;
  void *local_18;
  undefined8 *local_10;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_20 = *_a[1];
      local_10 = &local_20;
      iVar7 = 0;
      break;
    case 1:
      local_10 = &local_20;
      local_20 = CONCAT44(local_20._4_4_,*_a[1]);
      iVar7 = 1;
      break;
    case 2:
      local_10 = (undefined8 *)_a[1];
      iVar7 = 2;
      break;
    case 3:
      pQVar8 = (QSize *)_a[1];
LAB_00151e27:
      setIconSize((ToolBar *)_o,pQVar8);
      return;
    case 4:
      AVar4.i = *_a[1];
LAB_00151df7:
      setAlignment((ToolBar *)_o,AVar4);
      return;
    case 5:
      orientation = *_a[1];
LAB_00151e75:
      setOrientation((ToolBar *)_o,orientation);
      return;
    case 6:
      _q_leftArrowClicked((ToolBar *)_o);
      return;
    case 7:
      _q_rightArrowClicked((ToolBar *)_o);
      return;
    default:
      goto switchD_00151cbc_caseD_3;
    }
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,&local_18);
    break;
  case ReadProperty:
    pQVar8 = (QSize *)*_a;
    if (_id == 2) {
      AVar4 = alignment((ToolBar *)_o);
    }
    else {
      if (_id == 1) {
        QVar6 = iconSize((ToolBar *)_o);
        *pQVar8 = QVar6;
        return;
      }
      if (_id != 0) {
        return;
      }
      AVar4.i = ToolBar::orientation((ToolBar *)_o);
    }
    pQVar8->wd = AVar4.i;
    break;
  case WriteProperty:
    pQVar8 = (QSize *)*_a;
    if (_id == 2) {
      AVar4.i = pQVar8->wd;
      goto LAB_00151df7;
    }
    if (_id == 1) goto LAB_00151e27;
    if (_id == 0) {
      orientation = pQVar8->wd;
      goto LAB_00151e75;
    }
    break;
  case IndexOfMethod:
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == actionTriggered && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == orientationChanged && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == iconSizeChanged && lVar3 == 0) {
      *puVar1 = 2;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 0) {
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
        return;
      }
    }
    else {
      puVar5 = (undefined8 *)*_a;
    }
    *puVar5 = 0;
  }
switchD_00151cbc_caseD_3:
  return;
}

Assistant:

void QtMWidgets::ToolBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ToolBar *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->actionTriggered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 1: _t->orientationChanged((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1]))); break;
        case 2: _t->iconSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 3: _t->setIconSize((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 4: _t->setAlignment((*reinterpret_cast< std::add_pointer_t<Qt::Alignment>>(_a[1]))); break;
        case 5: _t->setOrientation((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1]))); break;
        case 6: _t->_q_leftArrowClicked(); break;
        case 7: _t->_q_rightArrowClicked(); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (ToolBar::*)(QAction * );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ToolBar::actionTriggered)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (ToolBar::*)(Qt::Orientation );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ToolBar::orientationChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (ToolBar::*)(const QSize & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ToolBar::iconSizeChanged)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<ToolBar *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< Qt::Orientation*>(_v) = _t->orientation(); break;
        case 1: *reinterpret_cast< QSize*>(_v) = _t->iconSize(); break;
        case 2: *reinterpret_cast< Qt::Alignment*>(_v) = _t->alignment(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<ToolBar *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrientation(*reinterpret_cast< Qt::Orientation*>(_v)); break;
        case 1: _t->setIconSize(*reinterpret_cast< QSize*>(_v)); break;
        case 2: _t->setAlignment(*reinterpret_cast< Qt::Alignment*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}